

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Abc_NtkDelayOpt(Sfm_Dec_t *p)

{
  Vec_Int_t *vNewNodes;
  uint iObj;
  uint uVar1;
  Sfm_Par_t *pPars;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pPivot;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  float fVar16;
  timespec ts;
  
  pPars = p->pPars;
  pNtk = p->pNtk;
  Abc_NtkCleanMarkABC(pNtk);
  if (pPars->nNodesMax < 0) {
LAB_00525095:
    Abc_NtkCleanMarkABC(pNtk);
    return;
  }
  vNewNodes = &p->vNewNodes;
  iVar15 = 0;
  do {
    iVar5 = pPars->iNodeOne;
    if (iVar5 == 0) {
      if (((p->pTim != (Sfm_Tim_t *)0x0) &&
          (iVar5 = Sfm_TimPriorityNodes(p->pTim,&p->vCands,p->pPars->nTimeWin), iVar5 == 0)) ||
         ((p->pMit != (Sfm_Mit_t *)0x0 &&
          (iVar5 = Sfm_MitPriorityNodes(p->pMit,&p->vCands,p->pPars->nTimeWin), iVar5 == 0))))
      goto LAB_00525095;
    }
    else {
      if ((p->vCands).nCap < 1) {
        piVar11 = (p->vCands).pArray;
        if (piVar11 == (int *)0x0) {
          piVar11 = (int *)malloc(4);
        }
        else {
          piVar11 = (int *)realloc(piVar11,4);
        }
        (p->vCands).pArray = piVar11;
        if (piVar11 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (p->vCands).nCap = 1;
      }
      *(p->vCands).pArray = iVar5;
      (p->vCands).nSize = 1;
    }
    if (0 < (p->vCands).nSize) {
      uVar14 = 0;
      do {
        iVar5 = (p->vCands).pArray[uVar14];
        if (((long)iVar5 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar5)) {
LAB_005250af:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pPivot = (Abc_Obj_t *)pVVar2->pArray[iVar5];
        if (pPivot != (Abc_Obj_t *)0x0) {
          iObj = pPivot->Id;
          if (p->pMit == (Sfm_Mit_t *)0x0) {
            iVar5 = Sfm_TimReadObjDelay(p->pTim,iObj);
          }
          else {
            iVar5 = Sfm_MitReadObjDelay(p->pMit,iObj);
          }
          if ((pPivot->field_0x14 & 0x10) != 0) {
            __assert_fail("pObj->fMarkA == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                          ,0x7d5,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
          }
          p->nNodesTried = p->nNodesTried + 1;
          iVar6 = clock_gettime(3,(timespec *)&ts);
          if (iVar6 < 0) {
            lVar12 = 1;
          }
          else {
            lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          iVar6 = Sfm_DecExtract(pNtk,pPars,pPivot,&p->vObjRoots,&p->vObjGates,&p->vObjFanins,
                                 &p->vObjMap,&p->vGateTfi,&p->vGateTfo,&p->vObjMffc,&p->vObjInMffc,
                                 p->pTim,p->pMit);
          p->nDivs = iVar6;
          iVar6 = clock_gettime(3,(timespec *)&ts);
          if (iVar6 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeWin = p->timeWin + lVar13 + lVar12;
          if ((1 < p->nDivs) &&
             ((pPars->nWinSizeMax == 0 || ((p->vObjGates).nSize <= pPars->nWinSizeMax)))) {
            p->nMffc = (p->vObjMffc).nSize;
            iVar6 = Sfm_DecMffcArea(pNtk,&p->vObjMffc);
            p->AreaMffc = iVar6;
            iVar6 = p->nDivs;
            iVar7 = p->nMaxDivs;
            if (p->nMaxDivs <= iVar6) {
              iVar7 = iVar6;
            }
            p->nMaxDivs = iVar7;
            p->nAllDivs = p->nAllDivs + (long)iVar6;
            p->iTarget = (pPivot->field_6).iTemp;
            iVar6 = (p->vObjGates).nSize;
            iVar7 = p->nMaxWin;
            if (p->nMaxWin <= iVar6) {
              iVar7 = iVar6;
            }
            p->nMaxWin = iVar7;
            p->nAllWin = p->nAllWin + (long)iVar6;
            iVar7 = clock_gettime(3,(timespec *)&ts);
            if (iVar7 < 0) {
              lVar12 = 1;
            }
            else {
              lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
              lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
            }
            iVar7 = Sfm_DecPrepareSolver(p);
            iVar8 = clock_gettime(3,(timespec *)&ts);
            if (iVar8 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            p->timeCnf = p->timeCnf + lVar13 + lVar12;
            if (iVar7 != 0) {
              iVar7 = clock_gettime(3,(timespec *)&ts);
              if (iVar7 < 0) {
                lVar12 = 1;
              }
              else {
                lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
              }
              iVar7 = Sfm_DecPeformDec3(p,pPivot);
              if (((pPars->fMoreEffort != 0) && (iVar7 < 0)) &&
                 (lVar13 = (long)(p->vObjInMffc).nSize, 0 < lVar13)) {
                do {
                  if ((p->vObjInMffc).nSize < lVar13) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  p->iUseThis = (p->vObjInMffc).pArray[lVar13 + -1];
                  iVar7 = Sfm_DecPeformDec3(p,pPivot);
                  p->iUseThis = -1;
                  if (-1 < iVar7) {
                    p->nEfforts = p->nEfforts + 1;
                    break;
                  }
                  bVar4 = 1 < lVar13;
                  lVar13 = lVar13 + -1;
                } while (bVar4);
              }
              if (p->pPars->fVeryVerbose != 0) {
                puts("\n");
              }
              iVar8 = clock_gettime(3,(timespec *)&ts);
              if (iVar8 < 0) {
                lVar13 = -1;
              }
              else {
                lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              p->timeSat = p->timeSat + lVar13 + lVar12;
              if (-1 < iVar7) {
                iVar7 = (p->vObjGates).nSize;
                if (iVar7 <= iVar6) {
                  __assert_fail("Vec_IntSize(&p->vObjGates) - Limit > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                                ,0x811,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                }
                if (2 < iVar7 - iVar6) {
                  __assert_fail("Vec_IntSize(&p->vObjGates) - Limit <= 2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                                ,0x812,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                }
                p->nNodesChanged = p->nNodesChanged + 1;
                Abc_NtkCountStats(p,iVar6);
                if (p->pMit != (Sfm_Mit_t *)0x0) {
                  Sfm_MitUpdateLoad(p->pMit,&p->vGateMffc,0);
                }
                Sfm_DecInsert(pNtk,pPivot,iVar6,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                              &p->vGateHands,p->GateBuffer,p->GateInvert,&p->vGateFuncs,vNewNodes,
                              p->pMit);
                if (p->pMit != (Sfm_Mit_t *)0x0) {
                  Sfm_MitUpdateLoad(p->pMit,vNewNodes,1);
                }
                iVar6 = clock_gettime(3,(timespec *)&ts);
                if (iVar6 < 0) {
                  lVar12 = 1;
                }
                else {
                  lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                  lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
                }
                if (p->pMit == (Sfm_Mit_t *)0x0) {
                  Sfm_TimUpdateTiming(p->pTim,vNewNodes);
                }
                else {
                  Sfm_MitUpdateTiming(p->pMit,vNewNodes);
                }
                iVar6 = clock_gettime(3,(timespec *)&ts);
                if (iVar6 < 0) {
                  lVar13 = -1;
                }
                else {
                  lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                p->timeTime = p->timeTime + lVar13 + lVar12;
                lVar12 = (long)pNtk->vObjs->nSize;
                if (lVar12 < 1) goto LAB_005250af;
                pvVar3 = pNtk->vObjs->pArray[lVar12 + -1];
                if (((p->pMit == (Sfm_Mit_t *)0x0) && (iVar6 = p->DelayMin, iVar6 != 0)) &&
                   (iVar7 = Sfm_TimReadObjDelay(p->pTim,*(int *)((long)pvVar3 + 0x10)),
                   iVar6 != iVar7)) {
                  __assert_fail("p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                                ,0x821,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                }
                if (pPars->fDelayVerbose != 0) {
                  uVar1 = (p->vCands).nSize;
                  iVar6 = p->pNtk->nObjCounts[7];
                  iVar7 = p->pNtk->vObjs->nSize;
                  iVar8 = *(int *)((long)pvVar3 + 0x10);
                  if (p->pMit == (Sfm_Mit_t *)0x0) {
                    iVar8 = Sfm_TimReadObjDelay(p->pTim,iVar8);
                  }
                  else {
                    iVar8 = Sfm_MitReadObjDelay(p->pMit,iVar8);
                  }
                  if (p->pMit == (Sfm_Mit_t *)0x0) {
                    iVar9 = Sfm_TimReadNtkDelay(p->pTim);
                  }
                  else {
                    iVar9 = Sfm_MitReadNtkDelay(p->pMit);
                  }
                  if (p->pMit == (Sfm_Mit_t *)0x0) {
                    fVar16 = 0.0;
                  }
                  else {
                    iVar10 = Sfm_MitReadNtkMinSlack(p->pMit);
                    fVar16 = (float)iVar10;
                  }
                  printf("Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f.  WNS =%8.2f.\n"
                         ,SUB84(((double)(int)uVar1 * 100.0) / (double)iVar6,0),
                         (double)((float)iVar5 / 1000.0),(double)((float)iVar8 / 1000.0),
                         (double)((float)iVar9 / 1000.0),(double)(fVar16 / 1000.0),(ulong)iObj,iVar7
                         ,uVar14 & 0xffffffff,(ulong)uVar1);
                }
                break;
              }
            }
          }
          pPivot->field_0x14 = pPivot->field_0x14 | 0x10;
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)(p->vCands).nSize);
    }
    if ((pPars->iNodeOne != 0) ||
       (iVar15 = iVar15 + 1, pPars->nNodesMax <= iVar15 && pPars->nNodesMax != 0))
    goto LAB_00525095;
  } while( true );
}

Assistant:

void Abc_NtkDelayOpt( Sfm_Dec_t * p )
{
    Abc_Ntk_t * pNtk = p->pNtk;
    Sfm_Par_t * pPars = p->pPars; int n;
    Abc_NtkCleanMarkABC( pNtk );
    for ( n = 0; pPars->nNodesMax == 0 || n < pPars->nNodesMax; n++ )
    {
        Abc_Obj_t * pObj, * pObjNew; abctime clk;
        int i = 0, Limit, RetValue;
        // collect nodes
        if ( pPars->iNodeOne )
            Vec_IntFill( &p->vCands, 1, pPars->iNodeOne );
        else if ( p->pTim && !Sfm_TimPriorityNodes(p->pTim, &p->vCands, p->pPars->nTimeWin) )
            break;
        else if ( p->pMit && !Sfm_MitPriorityNodes(p->pMit, &p->vCands, p->pPars->nTimeWin) )
            break;
        // try improving delay for the nodes according to the priority
        Abc_NtkForEachObjVec( &p->vCands, p->pNtk, pObj, i )
        {
            int OldId = Abc_ObjId(pObj);
            int DelayOld = Sfm_ManReadObjDelay(p, OldId);
            assert( pObj->fMarkA == 0 );
            p->nNodesTried++;
clk = Abc_Clock();
            p->nDivs = Sfm_DecExtract( pNtk, pPars, pObj, &p->vObjRoots, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateTfi, &p->vGateTfo, &p->vObjMffc, &p->vObjInMffc, p->pTim, p->pMit );
p->timeWin += Abc_Clock() - clk;
            if ( p->nDivs < 2 || (pPars->nWinSizeMax && pPars->nWinSizeMax < Vec_IntSize(&p->vObjGates)) )
            { 
                pObj->fMarkA = 1;
                continue;
            }
            p->nMffc = Vec_IntSize(&p->vObjMffc);
            p->AreaMffc = Sfm_DecMffcArea(pNtk, &p->vObjMffc);
            p->nMaxDivs = Abc_MaxInt( p->nMaxDivs, p->nDivs );
            p->nAllDivs += p->nDivs;
            p->iTarget = pObj->iTemp;
            Limit = Vec_IntSize( &p->vObjGates );
            p->nMaxWin = Abc_MaxInt( p->nMaxWin, Limit );
            p->nAllWin += Limit;
clk = Abc_Clock();
            RetValue = Sfm_DecPrepareSolver( p );
p->timeCnf += Abc_Clock() - clk;
            if ( !RetValue )
            {
                pObj->fMarkA = 1;
                continue;
            }
clk = Abc_Clock();
            RetValue = Sfm_DecPeformDec3( p, pObj );
            if ( pPars->fMoreEffort && RetValue < 0 )
            {
                int Var, i;
                Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
                {
                    p->iUseThis = Var; 
                    RetValue = Sfm_DecPeformDec3( p, pObj );
                    p->iUseThis = -1;
                    if ( RetValue < 0 )
                    {
                        //printf( "Node %d: Not found among %d.\n", Abc_ObjId(pObj), Vec_IntSize(&p->vObjInMffc) );
                    }
                    else
                    {
                        p->nEfforts++;
                        if ( p->pPars->fVerbose )
                        {
                            //printf( "Node %5d: (%2d out of %2d)  Gate=%s ", Abc_ObjId(pObj), i, Vec_IntSize(&p->vObjInMffc), Mio_GateReadName((Mio_Gate_t*)pObj->pData) );
                            //Dau_DsdPrintFromTruth( p->Copy, p->nSuppVars );
                        }
                        break;
                    }
                }
            }
            if ( p->pPars->fVeryVerbose )
                printf( "\n\n" );
p->timeSat += Abc_Clock() - clk;
            if ( RetValue < 0 )
            {
                pObj->fMarkA = 1;
                continue;
            }
            assert( Vec_IntSize(&p->vObjGates) - Limit > 0 );
            assert( Vec_IntSize(&p->vObjGates) - Limit <= 2 );
            p->nNodesChanged++;
            Abc_NtkCountStats( p, Limit );
            // reduce load due to removed MFFC
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vGateMffc, 0 ); // assuming &p->vGateMffc contains MFFC
            Sfm_DecInsert( pNtk, pObj, Limit, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateHands, p->GateBuffer, p->GateInvert, &p->vGateFuncs, &p->vNewNodes, p->pMit );
            // increase load due to added new nodes
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vNewNodes, 1 ); // assuming &p->vNewNodes contains new nodes
clk = Abc_Clock();
            if ( p->pMit )
                Sfm_MitUpdateTiming( p->pMit, &p->vNewNodes );
            else
                Sfm_TimUpdateTiming( p->pTim, &p->vNewNodes );
p->timeTime += Abc_Clock() - clk;
            pObjNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk)-1 );
            assert( p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew)) );
            // report
            if ( pPars->fDelayVerbose )
                printf( "Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f.  WNS =%8.2f.\n", 
                    OldId, Abc_NtkObjNumMax(p->pNtk), i, Vec_IntSize(&p->vCands), 100.0 * Vec_IntSize(&p->vCands) / Abc_NtkNodeNum(p->pNtk),
                    Scl_Int2Flt(DelayOld), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))), 
                    Scl_Int2Flt(Sfm_ManReadNtkDelay(p)), Scl_Int2Flt(Sfm_ManReadNtkMinSlack(p)) );
            break;
        }
        if ( pPars->iNodeOne )
            break;
    }
    Abc_NtkCleanMarkABC( pNtk );
}